

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Vec<Hpipe::Lexer::TrainingData> * __thiscall
Hpipe::Lexer::training_data(Vec<Hpipe::Lexer::TrainingData> *__return_storage_ptr__,Lexer *this)

{
  char *pcVar1;
  uint uVar2;
  double dVar3;
  char cVar4;
  _Alloc_hider _Var5;
  char cVar6;
  int iVar7;
  istream *piVar8;
  long *plVar9;
  uint *puVar10;
  undefined8 uVar11;
  long *plVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  Lexem *pLVar16;
  bool bVar17;
  string line;
  string freq;
  TrainingData td;
  istringstream is;
  int local_31c;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  allocator local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  Lexer *local_2d0;
  Lexem *local_2c8;
  char *local_2c0;
  long local_2b8;
  char local_2b0;
  undefined7 uStack_2af;
  vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>> *local_2a0;
  TrainingData local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230 [2];
  long local_220 [2];
  long *local_210 [2];
  long local_200 [2];
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  long local_1b0 [15];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar16 = (this->first_item).next;
  local_2a0 = (vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>> *)
              __return_storage_ptr__;
  if (pLVar16 != (Lexem *)0x0) {
    local_2d0 = this;
    do {
      local_298.inp._M_dataplus._M_p = (pointer)&local_298.inp.field_2;
      local_298.name._M_dataplus._M_p = (pointer)&local_298.name.field_2;
      if (pLVar16->type == TRAINING) {
        local_298.name._M_string_length = 0;
        local_298.name.field_2._M_local_buf[0] = '\0';
        local_298.inp._M_string_length = 0;
        local_298.inp.field_2._M_local_buf[0] = '\0';
        local_2c0 = &local_2b0;
        local_2b8 = 0;
        local_2b0 = '\0';
        std::__cxx11::string::substr((ulong)&local_2f0,(ulong)&pLVar16->str);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_1b0,(string *)&local_2f0,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,
                          CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                                   local_2f0.field_2._M_local_buf[0]) + 1);
        }
        cVar4 = (char)(istringstream *)local_1b0;
        cVar6 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar4);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_1b0,(string *)&local_298,cVar6);
        while ((local_298.name._M_string_length != 0 && (*local_298.name._M_dataplus._M_p == ' ')))
        {
          std::__cxx11::string::substr((ulong)&local_2f0,(ulong)&local_298);
          std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,
                            CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                                     local_2f0.field_2._M_local_buf[0]) + 1);
          }
        }
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        local_2f0._M_string_length = 0;
        local_2f0.field_2._M_local_buf[0] = '\0';
        local_31c = 0;
        iVar7 = 0;
        iVar15 = 0;
        local_2c8 = pLVar16;
        while( true ) {
          iVar13 = iVar7;
          cVar6 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar4);
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_1b0,(string *)&local_2f0,cVar6);
          if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
          if (local_2f0._M_string_length < 4) {
            bVar17 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_2f0);
            iVar7 = std::__cxx11::string::compare((char *)local_1d0);
            bVar17 = iVar7 == 0;
            if (local_1d0[0] != local_1c0) {
              operator_delete(local_1d0[0],local_1c0[0] + 1);
            }
          }
          iVar7 = iVar13;
          if (bVar17) {
            if (local_2f0._M_string_length < 8) {
              bVar17 = false;
            }
            else {
              std::__cxx11::string::substr((ulong)local_1f0,(ulong)&local_2f0);
              iVar7 = std::__cxx11::string::compare((char *)local_1f0);
              bVar17 = iVar7 == 0;
              if (local_1f0[0] != local_1e0) {
                operator_delete(local_1f0[0],local_1e0[0] + 1);
              }
            }
            if (bVar17) {
              if (iVar13 == 0) {
                ErrorList::add(local_2d0->error_list,local_2c8->source,local_2c8->beg,
                               "String inside test must have spaces at the beginning: 1 space for command names, at least 2 for command data"
                              );
                iVar7 = 0;
              }
              else if (iVar13 == 1) {
                if (iVar15 != 0) {
                  std::__cxx11::string::push_back((char)&local_298 + '(');
                }
                std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_2f0);
                std::__cxx11::string::_M_append((char *)&local_298.inp,(ulong)local_318);
                if (local_318 != &local_308) {
                  operator_delete(local_318,local_308 + 1);
                }
                iVar7 = 1;
                iVar15 = iVar15 + 1;
              }
              else {
                if (local_31c != 0) {
                  std::__cxx11::string::push_back((char)&local_2c0);
                }
                std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_2f0);
                std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_318);
LAB_00178a18:
                if (local_318 != &local_308) {
                  operator_delete(local_318,local_308 + 1);
                }
                local_31c = local_31c + 1;
                iVar7 = 2;
              }
            }
            else {
              if (local_2f0._M_string_length < 7) {
                bVar17 = false;
              }
              else {
                std::__cxx11::string::substr((ulong)local_210,(ulong)&local_2f0);
                iVar7 = std::__cxx11::string::compare((char *)local_210);
                bVar17 = iVar7 == 0;
                if (local_210[0] != local_200) {
                  operator_delete(local_210[0],local_200[0] + 1);
                }
              }
              iVar7 = 1;
              if (!bVar17) {
                if (local_2f0._M_string_length < 8) {
                  bVar17 = false;
                }
                else {
                  std::__cxx11::string::substr((ulong)local_230,(ulong)&local_2f0);
                  iVar7 = std::__cxx11::string::compare((char *)local_230);
                  bVar17 = iVar7 == 0;
                  if (local_230[0] != local_220) {
                    operator_delete(local_230[0],local_220[0] + 1);
                  }
                }
                iVar7 = 2;
                if (!bVar17) {
                  bVar17 = local_2f0._M_string_length == 0;
                  if ((!bVar17) && (*local_2f0._M_dataplus._M_p == ' ')) {
                    uVar14 = 1;
                    do {
                      bVar17 = local_2f0._M_string_length == uVar14;
                      if (bVar17) break;
                      pcVar1 = local_2f0._M_dataplus._M_p + uVar14;
                      uVar14 = uVar14 + 1;
                    } while (*pcVar1 == ' ');
                  }
                  if (!bVar17) {
                    std::operator+(&local_250,"Unknown test command \'",&local_2f0);
                    plVar9 = (long *)std::__cxx11::string::append((char *)&local_250);
                    plVar12 = plVar9 + 2;
                    if ((long *)*plVar9 == plVar12) {
                      local_308 = *plVar12;
                      lStack_300 = plVar9[3];
                      local_318 = &local_308;
                    }
                    else {
                      local_308 = *plVar12;
                      local_318 = (long *)*plVar9;
                    }
                    local_310 = plVar9[1];
                    *plVar9 = (long)plVar12;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    ErrorList::add(local_2d0->error_list,local_2c8->source,local_2c8->beg,
                                   (char *)local_318);
                    if (local_318 != &local_308) {
                      operator_delete(local_318,local_308 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_250._M_dataplus._M_p != &local_250.field_2) {
                      operator_delete(local_250._M_dataplus._M_p,
                                      local_250.field_2._M_allocated_capacity + 1);
                    }
                    break;
                  }
                  if (iVar13 == 2) {
                    if (local_31c != 0) {
                      std::__cxx11::string::push_back((char)&local_2c0);
                    }
                    std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_2f0);
                    std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_318);
                    if (local_318 != &local_308) {
                      operator_delete(local_318,local_308 + 1);
                    }
                    local_31c = local_31c + 1;
                  }
                  else {
                    iVar7 = iVar13;
                    if (iVar13 == 1) {
                      iVar13 = iVar15 + 1;
                      bVar17 = iVar15 != 0;
                      iVar7 = 1;
                      iVar15 = iVar13;
                      if (bVar17) {
                        std::__cxx11::string::push_back((char)&local_298 + '(');
                        iVar7 = 1;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            bVar17 = local_2f0._M_string_length == 0;
            if ((!bVar17) && (*local_2f0._M_dataplus._M_p == ' ')) {
              uVar14 = 1;
              do {
                bVar17 = local_2f0._M_string_length == uVar14;
                if (bVar17) break;
                pcVar1 = local_2f0._M_dataplus._M_p + uVar14;
                uVar14 = uVar14 + 1;
              } while (*pcVar1 == ' ');
            }
            if (bVar17) {
              if (iVar13 == 2) {
                if (local_31c != 0) {
                  std::__cxx11::string::push_back((char)&local_2c0);
                }
                std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_2f0);
                std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_318);
                goto LAB_00178a18;
              }
              if (iVar13 == 1) {
                iVar13 = iVar15 + 1;
                bVar17 = iVar15 != 0;
                iVar7 = 1;
                iVar15 = iVar13;
                if (bVar17) {
                  std::__cxx11::string::push_back((char)&local_298 + '(');
                }
              }
            }
            else {
              ErrorList::add(local_2d0->error_list,local_2c8->source,local_2c8->beg,
                             "String inside test must have spaces at the beginning: 4 spaces for command names, at least 8 for command data"
                            );
            }
          }
        }
        std::__cxx11::string::string((string *)&local_318,local_2c0,&local_2f1);
        plVar9 = local_318;
        puVar10 = (uint *)__errno_location();
        uVar2 = *puVar10;
        *puVar10 = 0;
        dVar3 = strtod((char *)plVar9,(char **)&local_250);
        _Var5._M_p = local_250._M_dataplus._M_p;
        if ((long *)local_250._M_dataplus._M_p == plVar9) {
          std::__throw_invalid_argument("stod");
LAB_00178ddf:
          uVar11 = std::__throw_out_of_range("stod");
          if (local_318 != (long *)(ulong)uVar2) {
            operator_delete(local_318,local_308 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,
                            CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                                     local_2f0.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
          std::ios_base::~ios_base(local_138);
          if (local_2c0 != &local_2b0) {
            operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
          }
          TrainingData::~TrainingData(&local_298);
          std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::
          ~vector((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *
                  )local_2a0);
          _Unwind_Resume(uVar11);
        }
        if (*puVar10 == 0) {
          *puVar10 = uVar2;
        }
        else if (*puVar10 == 0x22) goto LAB_00178ddf;
        local_298.freq = dVar3;
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        pLVar16 = local_2c8;
        if ((long *)_Var5._M_p == plVar9) {
          if (local_2b8 != 0) {
            ErrorList::add(local_2d0->error_list,local_2c8->source,local_2c8->beg,
                           "Freq does not appear to be a correct number");
          }
          local_298.freq = 1.0;
        }
        std::vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>>::
        emplace_back<Hpipe::Lexer::TrainingData_const&>(local_2a0,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,
                          CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                                   local_2f0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298.inp._M_dataplus._M_p != &local_298.inp.field_2) {
          operator_delete(local_298.inp._M_dataplus._M_p,
                          CONCAT71(local_298.inp.field_2._M_allocated_capacity._1_7_,
                                   local_298.inp.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298.name._M_dataplus._M_p != &local_298.name.field_2) {
          operator_delete(local_298.name._M_dataplus._M_p,
                          CONCAT71(local_298.name.field_2._M_allocated_capacity._1_7_,
                                   local_298.name.field_2._M_local_buf[0]) + 1);
        }
      }
      pLVar16 = pLVar16->next;
    } while (pLVar16 != (Lexem *)0x0);
  }
  return (Vec<Hpipe::Lexer::TrainingData> *)local_2a0;
}

Assistant:

const Lexem *Lexer::find_machine( const std::string &name) const {
    const Lexem *margs;
    return find_machine( margs, name );
}